

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.hpp
# Opt level: O3

void __thiscall Cache::Block::Block(Block *this,Block *b)

{
  uint32_t uVar1;
  
  this->valid = false;
  this->dirty = false;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->tag = 0;
  this->id = 0;
  this->size = 0;
  this->last_reference = 0;
  this->valid = b->valid;
  this->dirty = b->dirty;
  uVar1 = b->id;
  this->tag = b->tag;
  this->id = uVar1;
  this->size = b->size;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->data,&b->data);
  return;
}

Assistant:

Block(const Block &b) {
            valid = b.valid;
            dirty = b.dirty;
            tag = b.tag;
            id = b.id;
            size = b.size;
            data = b.data;
        }